

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

void __thiscall
QOpenGLShaderProgramPrivate::~QOpenGLShaderProgramPrivate(QOpenGLShaderProgramPrivate *this)

{
  *(undefined ***)this = &PTR__QOpenGLShaderProgramPrivate_001a1078;
  operator_delete(this->glfuncs,8);
  if (this->programGuard != (QOpenGLSharedResourceGuard *)0x0) {
    QOpenGLSharedResource::free();
  }
  QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::~QArrayDataPointer
            ((QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc> *)&this->binaryProgram);
  QArrayDataPointer<QOpenGLShader_*>::~QArrayDataPointer(&(this->anonShaders).d);
  QArrayDataPointer<QOpenGLShader_*>::~QArrayDataPointer(&(this->shaders).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->log).d);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QOpenGLShaderProgramPrivate::~QOpenGLShaderProgramPrivate()
{
    delete glfuncs;
    if (programGuard)
        programGuard->free();
}